

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * __thiscall
google::protobuf::FieldDescriptor::DefaultValueAsString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this,bool quote_string_type)

{
  FieldDescriptor FVar1;
  string *src;
  long lVar2;
  LogMessage *pLVar3;
  code *other;
  long *plVar4;
  int **ppiVar5;
  size_type *psVar6;
  undefined7 in_register_00000011;
  unsigned_long i;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  char *pcVar7;
  pointer pcVar8;
  char *pcVar9;
  pointer pcVar10;
  undefined1 local_b8 [16];
  int *local_a8;
  _Alloc_hider _Stack_a0;
  string local_80;
  LogMessage local_60;
  
  i = CONCAT71(in_register_00000011,quote_string_type);
  other = (code *)this;
  if (this[0x98] == (FieldDescriptor)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x729);
    pLVar3 = internal::LogMessage::operator<<(&local_60,"CHECK failed: has_default_value(): ");
    other = (code *)internal::LogMessage::operator<<(pLVar3,"No default value");
    internal::LogFinisher::operator=((LogFinisher *)local_b8,(LogMessage *)other);
    internal::LogMessage::~LogMessage(&local_60);
    i = extraout_RDX;
  }
  if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
    other = TypeOnceInit;
    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
              (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
    i = extraout_RDX_00;
  }
  switch(*(undefined4 *)(kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x48) * 4)) {
  case 1:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(this + 0xa0),(uint)i);
    break;
  case 2:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,*(protobuf **)(this + 0xa0),i);
    break;
  case 3:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(this + 0xa0),(uint)i);
    break;
  case 4:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,*(protobuf **)(this + 0xa0),i);
    break;
  case 5:
    SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)other,*(double *)(this + 0xa0));
    break;
  case 6:
    SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)other,*(float *)(this + 0xa0));
    break;
  case 7:
    FVar1 = this[0xa0];
    pcVar9 = "false";
    if ((ulong)(byte)FVar1 != 0) {
      pcVar9 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = pcVar9 + ((ulong)(byte)FVar1 ^ 5);
    goto LAB_002d90d0;
  case 8:
    if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
    }
    plVar4 = (long *)**(long **)(this + 0xa0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = (pointer)*plVar4;
    pcVar8 = pcVar10 + plVar4[1];
    goto LAB_002d9077;
  case 9:
    if (quote_string_type) {
      CEscape(&local_80,*(string **)(this + 0xa0));
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x356813);
      ppiVar5 = (int **)(plVar4 + 2);
      if ((int **)*plVar4 == ppiVar5) {
        local_a8 = *ppiVar5;
        _Stack_a0._M_p = (pointer)plVar4[3];
        local_b8._0_8_ = &local_a8;
      }
      else {
        local_a8 = *ppiVar5;
        local_b8._0_8_ = (int **)*plVar4;
      }
      local_b8._8_8_ = plVar4[1];
      *plVar4 = (long)ppiVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append(local_b8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar6) {
        lVar2 = plVar4[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      }
      __return_storage_ptr__->_M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((int **)local_b8._0_8_ != &local_a8) {
        operator_delete((void *)local_b8._0_8_,(long)local_a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p == &local_80.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
    }
    src = *(string **)(this + 0xa0);
    if (*(int *)(this + 0x48) == 0xc) {
      CEscape(__return_storage_ptr__,src);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = (src->_M_dataplus)._M_p;
    pcVar8 = pcVar10 + src->_M_string_length;
LAB_002d9077:
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar10,pcVar8);
    break;
  case 10:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x74f);
    pLVar3 = internal::LogMessage::operator<<
                       ((LogMessage *)local_b8,"Messages can\'t have default values!");
    internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar3);
    internal::LogMessage::~LogMessage((LogMessage *)local_b8);
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x752);
    pLVar3 = internal::LogMessage::operator<<
                       ((LogMessage *)local_b8,
                        "Can\'t get here: failed to get default value as string");
    internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar3);
    internal::LogMessage::~LogMessage((LogMessage *)local_b8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "";
    pcVar9 = "";
LAB_002d90d0:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

string FieldDescriptor::DefaultValueAsString(bool quote_string_type) const {
  GOOGLE_CHECK(has_default_value()) << "No default value";
  switch (cpp_type()) {
    case CPPTYPE_INT32:
      return SimpleItoa(default_value_int32());
      break;
    case CPPTYPE_INT64:
      return SimpleItoa(default_value_int64());
      break;
    case CPPTYPE_UINT32:
      return SimpleItoa(default_value_uint32());
      break;
    case CPPTYPE_UINT64:
      return SimpleItoa(default_value_uint64());
      break;
    case CPPTYPE_FLOAT:
      return SimpleFtoa(default_value_float());
      break;
    case CPPTYPE_DOUBLE:
      return SimpleDtoa(default_value_double());
      break;
    case CPPTYPE_BOOL:
      return default_value_bool() ? "true" : "false";
      break;
    case CPPTYPE_STRING:
      if (quote_string_type) {
        return "\"" + CEscape(default_value_string()) + "\"";
      } else {
        if (type() == TYPE_BYTES) {
          return CEscape(default_value_string());
        } else {
          return default_value_string();
        }
      }
      break;
    case CPPTYPE_ENUM:
      return default_value_enum()->name();
      break;
    case CPPTYPE_MESSAGE:
      GOOGLE_LOG(DFATAL) << "Messages can't have default values!";
      break;
  }
  GOOGLE_LOG(FATAL) << "Can't get here: failed to get default value as string";
  return "";
}